

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneAllocAndFree_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneAllocAndFree_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test *this_00;
  TEST_MemoryLeakDetectorTest_OneAllocAndFree_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x151);
  TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test::TEST_MemoryLeakDetectorTest_OneAllocAndFree_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneAllocAndFree)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 10, "file.cpp", 1234);
    char* mem2 = detector->allocMemory(defaultMallocAllocator(), 12);
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking));
    SimpleString output = detector->report(mem_leak_period_checking);
    CHECK(output.contains("malloc"));
    detector->deallocMemory(defaultMallocAllocator(), mem);
    detector->deallocMemory(defaultMallocAllocator(), mem2, "file.c", 5678);
    LONGS_EQUAL(0, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->stopChecking();
}